

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall
QPDFArgParser::addHelpTopic(QPDFArgParser *this,string *topic,string *short_text,string *long_text)

{
  element_type *peVar1;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  mapped_type *this_00;
  mapped_type *pmVar5;
  logic_error *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  HelpTopic local_a0;
  
  bVar2 = std::operator==(topic,"all");
  if (bVar2) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a0.short_text,"QPDFArgParser: can\'t register reserved help topic ",topic)
    ;
    std::logic_error::logic_error(plVar6,(string *)&local_a0);
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (topic->_M_string_length != 0) {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)topic);
    if (*pcVar3 != '-') {
      sVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
              ::count(&((this->m).
                        super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->help_topics,topic);
      if (sVar4 == 0) {
        HelpTopic::HelpTopic(&local_a0,short_text,long_text);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
                  ::operator[](&((this->m).
                                 super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->help_topics,topic);
        HelpTopic::operator=(this_00,&local_a0);
        HelpTopic::~HelpTopic(&local_a0);
        peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"help",(allocator<char> *)&local_c0);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                 ::operator[](&peVar1->help_option_table,&local_a0.short_text);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pmVar5->choices,topic);
        std::__cxx11::string::~string((string *)&local_a0);
        return;
      }
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_c0,"QPDFArgParser: topic ",topic);
      std::operator+(&local_a0.short_text,&local_c0," has already been added");
      std::logic_error::logic_error(plVar6,(string *)&local_a0);
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar6,"QPDFArgParser: help topics must not start with -");
  __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFArgParser::addHelpTopic(
    std::string const& topic, std::string const& short_text, std::string const& long_text)
{
    if (topic == "all") {
        QTC::TC("libtests", "QPDFArgParser add reserved help topic");
        throw std::logic_error("QPDFArgParser: can't register reserved help topic " + topic);
    }
    if (!((topic.length() > 0) && (topic.at(0) != '-'))) {
        QTC::TC("libtests", "QPDFArgParser bad topic for help");
        throw std::logic_error("QPDFArgParser: help topics must not start with -");
    }
    if (m->help_topics.count(topic)) {
        QTC::TC("libtests", "QPDFArgParser add existing topic");
        throw std::logic_error("QPDFArgParser: topic " + topic + " has already been added");
    }

    m->help_topics[topic] = HelpTopic(short_text, long_text);
    m->help_option_table["help"].choices.insert(topic);
}